

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-stack.cpp
# Opt level: O2

void __thiscall wasm::BinaryInstWriter::visitAtomicNotify(BinaryInstWriter *this,AtomicNotify *curr)

{
  BufferWithRandomAccess *this_00;
  
  this_00 = BufferWithRandomAccess::operator<<(this->o,-2);
  BufferWithRandomAccess::operator<<(this_00,'\0');
  emitMemoryAccess(this,4,4,(curr->offset).addr,(Name)(curr->memory).super_IString.str);
  return;
}

Assistant:

void BinaryInstWriter::visitAtomicNotify(AtomicNotify* curr) {
  o << int8_t(BinaryConsts::AtomicPrefix) << int8_t(BinaryConsts::AtomicNotify);
  emitMemoryAccess(4, 4, curr->offset, curr->memory);
}